

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::AddSentinelTexture
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,ConversionData *conv_data)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  aiString name;
  aiString local_424;
  
  local_424.length = 0;
  local_424.data[0] = '\0';
  memset(local_424.data + 1,0x1b,0x3ff);
  uVar1 = conv_data->sentinel_cnt;
  conv_data->sentinel_cnt = uVar1 + 1;
  uVar2 = ((tex->tex).super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          type - Type_CLOUDS;
  if (uVar2 < 0xd) {
    pcVar3 = &DAT_006e17f0 + *(int *)(&DAT_006e17f0 + (ulong)uVar2 * 4);
  }
  else {
    pcVar3 = "<Unknown>";
  }
  local_424.length = snprintf(local_424.data,0x400,"Procedural,num=%i,type=%s",(ulong)uVar1,pcVar3);
  uVar1 = conv_data->next_texture[1];
  conv_data->next_texture[1] = uVar1 + 1;
  aiMaterial::AddProperty(out,&local_424,"$tex.file",1,uVar1);
  return;
}

Assistant:

void BlenderImporter::AddSentinelTexture(aiMaterial* out, const Material* mat, const MTex* tex, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;

    aiString name;
    name.length = ai_snprintf(name.data, MAXLEN, "Procedural,num=%i,type=%s",conv_data.sentinel_cnt++,
        GetTextureTypeDisplayString(tex->tex->type)
    );
    out->AddProperty(&name,AI_MATKEY_TEXTURE_DIFFUSE(
        conv_data.next_texture[aiTextureType_DIFFUSE]++)
    );
}